

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_rect.cpp
# Opt level: O1

void __thiscall CUIRect::VSplitRight(CUIRect *this,float Cut,CUIRect *pLeft,CUIRect *pRight)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  uVar3 = this->x;
  uVar4 = this->y;
  fVar1 = this->w;
  fVar2 = this->h;
  if (pLeft != (CUIRect *)0x0) {
    pLeft->x = (float)uVar3;
    pLeft->y = (float)uVar4;
    pLeft->w = fVar1 - Cut;
    pLeft->h = fVar2;
  }
  if (pRight != (CUIRect *)0x0) {
    pRight->x = (fVar1 + (float)uVar3) - Cut;
    pRight->y = (float)uVar4;
    pRight->w = Cut;
    pRight->h = fVar2;
  }
  return;
}

Assistant:

void CUIRect::VSplitRight(float Cut, CUIRect *pLeft, CUIRect *pRight) const
{
	CUIRect r = *this;

	if(pLeft)
	{
		pLeft->x = r.x;
		pLeft->y = r.y;
		pLeft->w = r.w - Cut;
		pLeft->h = r.h;
	}

	if(pRight)
	{
		pRight->x = r.x + r.w - Cut;
		pRight->y = r.y;
		pRight->w = Cut;
		pRight->h = r.h;
	}
}